

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_constdump(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  ushort uVar2;
  skill_type *psVar3;
  FILE *__s;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  skill_type *psVar10;
  
  __s = fopen("../logs/constdump.txt","w");
  if (__s != (FILE *)0x0) {
    psVar10 = skill_table;
    lVar8 = 0;
    do {
      fwrite("\t{\n",3,1,__s);
      fprintf(__s,"\t\t\"%s\"\t\t{ ",skill_table[lVar8].name);
      for (lVar9 = 4; lVar9 != 0x10; lVar9 = lVar9 + 1) {
        fprintf(__s,"%i, ",(ulong)(uint)(int)psVar10->skill_level[lVar9 + -4]);
      }
      fwrite("},\n",3,1,__s);
      fwrite("\t\t{ ",4,1,__s);
      fwrite("},\n",3,1,__s);
      uVar2 = skill_table[lVar8].target;
      if ((ulong)uVar2 < 10) {
        pcVar5 = &DAT_003c9a80 + *(int *)(&DAT_003c9a80 + (ulong)uVar2 * 4);
      }
      else {
        pcVar5 = "ERROR";
        if (uVar2 == 0x29a) {
          pcVar5 = "TAR_END";
        }
      }
      fprintf(__s,"\t\tspell_null,\t\t%s,",pcVar5);
      uVar2 = skill_table[lVar8].minimum_position;
      if ((ulong)uVar2 < 8) {
        pcVar5 = &DAT_003c9aa8 + *(int *)(&DAT_003c9aa8 + (ulong)uVar2 * 4);
      }
      else {
        pcVar5 = "ERROR";
        if (uVar2 == 8) {
          pcVar5 = "POS_STANDING";
        }
      }
      fprintf(__s,"\t\t%s,\n",pcVar5);
      uVar2 = skill_table[lVar8].dispel;
      pcVar5 = "CAN_DISPEL";
      if ((uVar2 & 1) == 0) {
        pcVar5 = "";
      }
      pcVar4 = "CAN_CANCEL";
      if ((uVar2 & 2) == 0) {
        pcVar4 = "";
      }
      pcVar6 = "CAN_CLEANSE";
      if ((uVar2 & 4) == 0) {
        pcVar6 = "";
      }
      pcVar7 = "CAN_PURIFY";
      if ((uVar2 & 8) == 0) {
        pcVar7 = "";
      }
      fprintf(__s,"\t\t&gsn_none,\t%s%s%s%s,\t%d,\t%d,\n",pcVar5,pcVar4,pcVar6,pcVar7,
              (ulong)(uint)(int)skill_table[lVar8].min_mana,
              (ulong)(uint)(int)skill_table[lVar8].beats);
      uVar1 = *(int *)&skill_table[lVar8].ctype - 1;
      if ((ushort)uVar1 < 5) {
        pcVar5 = (char *)((long)&DAT_003c9ac8 + (long)(int)(&DAT_003c9ac8)[uVar1 & 0xffff]);
      }
      else {
        pcVar5 = "ERROR";
        if ((short)*(int *)&skill_table[lVar8].ctype == 0) {
          pcVar5 = "CMD_NONE";
        }
      }
      fprintf(__s,"\t\t\"%s\",\t\"%s\",\t\"%s\",\t%s\n",skill_table[lVar8].noun_damage,
              skill_table[lVar8].msg_off,skill_table[lVar8].room_msg_off,pcVar5);
      fwrite("\t},\n\n",5,1,__s);
      psVar10 = psVar10 + 1;
      psVar3 = skill_table + lVar8;
      lVar8 = lVar8 + 1;
    } while (psVar3->target != 0x29a);
    fclose(__s);
    send_to_char("Const.c dump completed and successful.\n\r",ch);
    return;
  }
  return;
}

Assistant:

void do_constdump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(CONST_DUMP_FILE, "w"), *fp2;
	int sn, i;

	if (!fp)
		return;

	for (sn = 0;; sn++)
	{
		fprintf(fp, "\t{\n");
		fprintf(fp, "\t\t\"%s\"\t\t{ ", skill_table[sn].name);

		for (i = 0; i < MAX_CLASS; i++)
		{
			fprintf(fp, "%i, ", skill_table[sn].skill_level[i]);
		}

		fprintf(fp, "},\n");
		fprintf(fp, "\t\t{ ");
		fprintf(fp, "},\n");
		fprintf(fp, "\t\tspell_null,\t\t%s,",
			skill_table[sn].target == TAR_CHAR_OFFENSIVE ? "TAR_CHAR_OFFENSIVE" :
			skill_table[sn].target == TAR_CHAR_DEFENSIVE ? "TAR_CHAR_DEFENSIVE" :
			skill_table[sn].target == TAR_CHAR_AMBIGUOUS ? "TAR_CHAR_AMBIGUOUS" :
			skill_table[sn].target == TAR_IGNORE ? "TAR_IGNORE" :
			skill_table[sn].target == TAR_CHAR_SELF ? "TAR_CHAR_SELF" :
			skill_table[sn].target == TAR_CHAR_GENERAL ? "TAR_CHAR_GENERAL" :
			skill_table[sn].target == TAR_OBJ_INV ? "TAR_OBJ_INV" :
			skill_table[sn].target == TAR_OBJ_CHAR_DEF ? "TAR_OBJ_CHAR_DEF" :
			skill_table[sn].target == TAR_OBJ_CHAR_OFF ? "TAR_OBJ_CHAR_OFF" :
			skill_table[sn].target == TAR_DIR ? "TAR_DIR" :
			skill_table[sn].target == TAR_END ? "TAR_END" : "ERROR");

		fprintf(fp, "\t\t%s,\n",
			skill_table[sn].minimum_position == POS_DEAD ? "POS_DEAD" :
			skill_table[sn].minimum_position == POS_MORTAL ? "POS_MORTAL" :
			skill_table[sn].minimum_position == POS_INCAP ? "POS_INCAP" :
			skill_table[sn].minimum_position == POS_STUNNED ? "POS_STUNNED" :
			skill_table[sn].minimum_position == POS_SLEEPING ? "POS_SLEEPING" :
			skill_table[sn].minimum_position == POS_RESTING ? "POS_RESTING" :
			skill_table[sn].minimum_position == POS_SITTING ? "POS_SITTING" :
			skill_table[sn].minimum_position == POS_FIGHTING ? "POS_FIGHTING" :
			skill_table[sn].minimum_position == POS_STANDING ? "POS_STANDING" : "ERROR");

		fprintf(fp, "\t\t&gsn_none,\t%s%s%s%s,\t%d,\t%d,\n",
			skill_table[sn].dispel & CAN_DISPEL ? "CAN_DISPEL" : "",
			skill_table[sn].dispel & CAN_CANCEL ? "CAN_CANCEL" : "",
			skill_table[sn].dispel & CAN_CLEANSE ? "CAN_CLEANSE" : "",
			skill_table[sn].dispel & CAN_PURIFY ? "CAN_PURIFY" : "",
			skill_table[sn].min_mana,
			skill_table[sn].beats);

		fprintf(fp, "\t\t\"%s\",\t\"%s\",\t\"%s\",\t%s\n",
			skill_table[sn].noun_damage,
			skill_table[sn].msg_off,
			skill_table[sn].room_msg_off,
			skill_table[sn].ctype == CMD_SPELL ? "CMD_SPELL" :
				skill_table[sn].ctype == CMD_COMMUNE ? "CMD_COMMUNE" :
				skill_table[sn].ctype == CMD_POWER ? "CMD_POWER" :
				skill_table[sn].ctype == CMD_BOTH  ? "CMD_BOTH"  :
				skill_table[sn].ctype == CMD_RUNE  ? "CMD_RUNE"  :
				skill_table[sn].ctype == CMD_NONE ? "CMD_NONE" : "ERROR");

		fprintf(fp, "\t},\n\n");

		if (skill_table[sn].target == TAR_END)
			break;
	}

	fclose(fp);

	send_to_char("Const.c dump completed and successful.\n\r", ch);
}